

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeAddrMode3Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  uint RegNo;
  uint uVar3;
  uint uVar4;
  DecodeStatus DVar5;
  bool bVar6;
  void *pvVar7;
  uint uVar8;
  void *Address_01;
  void *extraout_RDX;
  uint64_t Address_02;
  uint64_t extraout_RDX_00;
  uint64_t Address_03;
  uint64_t extraout_RDX_01;
  uint64_t Address_04;
  uint64_t Address_05;
  uint64_t Address_06;
  uint RegNo_00;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  void *pvStack_60;
  void *Address_00;
  
  uVar9 = Insn >> 0xc & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  if ((uVar2 - 0x1a8 < 3) || (uVar2 - 0xa0 < 3)) {
    pvStack_60 = (void *)(ulong)((uint)((Insn >> 0xc & 1) == 0) * 2 + 1);
  }
  else {
    pvStack_60 = (void *)0x3;
  }
  RegNo_00 = Insn >> 0x10 & 0xf;
  RegNo = Insn & 0xf;
  uVar1 = Insn >> 0x16;
  uVar10 = ~Insn >> 0xf & 0x100;
  uVar2 = uVar9 + 1;
  uVar3 = Insn & 0x1200000;
  uVar4 = MCInst_getOpcode(Inst);
  uVar8 = uVar4 - 0xa0;
  Address_00 = (void *)(ulong)uVar8;
  pvVar7 = (void *)0x7;
  if (uVar8 < 0x19) {
    if ((0x19c8000U >> (uVar8 & 0x1f) & 1) == 0) {
      if ((7U >> (uVar8 & 0x1f) & 1) == 0) {
        if ((0xc80U >> (uVar8 & 0x1f) & 1) == 0) goto LAB_0014ca3c;
        bVar11 = (uVar1 & 1) == 0;
        bVar6 = RegNo_00 != 0xf || bVar11;
        if (RegNo_00 != 0xf || bVar11) {
          if (uVar9 == 0xf) {
            pvStack_60 = (void *)0x1;
          }
          Address_00 = (void *)0x1;
          if ((uVar1 & 1) != 0) {
            Address_00 = pvStack_60;
          }
          pvVar7 = (void *)(ulong)(RegNo ^ 0xf | uVar1 & 1);
          goto joined_r0x0014cc76;
        }
      }
      else {
        bVar11 = (uVar1 & 1) == 0;
        bVar6 = RegNo_00 != 0xf || bVar11;
        if (RegNo_00 != 0xf || bVar11) {
          pvVar7 = (void *)(ulong)uVar3;
          uVar4 = uVar1;
          if ((uVar1 & 1) == 0) {
            uVar4 = uVar2;
          }
          Address_00 = (void *)(ulong)uVar4;
          goto joined_r0x0014cc76;
        }
      }
      Address_00 = (void *)(ulong)uVar1;
      pvVar7 = (void *)(ulong)bVar6;
      goto joined_r0x0014cc76;
    }
    Address_00 = (void *)(ulong)uVar1;
    bVar6 = (uVar1 & 1) == 0;
    pvVar7 = (void *)(ulong)(RegNo_00 != 0xf || bVar6);
    if (RegNo_00 == 0xf && !bVar6) goto joined_r0x0014cc76;
  }
  else {
LAB_0014ca3c:
    uVar4 = uVar4 - 0x1a8;
    if (0xb < uVar4) goto joined_r0x0014cc76;
    Address_00 = (void *)(ulong)uVar1;
    if ((7U >> (uVar4 & 0x1f) & 1) == 0) {
      pvVar7 = (void *)0xc80;
      if ((0xc80U >> (uVar4 & 0x1f) & 1) != 0) {
        pvVar7 = (void *)(ulong)(uVar1 & 1);
        Address_00 = (void *)(ulong)(RegNo ^ 0xf | uVar1 & 1);
      }
      goto joined_r0x0014cc76;
    }
    if (uVar3 == 0x200000) {
      pvStack_60 = (void *)0x1;
    }
    if (uVar3 != 0x1000000) {
      if (RegNo_00 == uVar2) {
        pvStack_60 = (void *)0x1;
      }
      if (RegNo_00 == uVar9) {
        pvStack_60 = (void *)0x1;
      }
      if (RegNo_00 == 0xf) {
        pvStack_60 = (void *)0x1;
      }
    }
    if (uVar2 == 0xf) {
      pvStack_60 = (void *)0x1;
    }
    pvVar7 = pvStack_60;
    if ((uVar1 & 1) != 0) {
      pvVar7 = (void *)0x1;
    }
    if (RegNo != 0xf) {
      pvVar7 = pvStack_60;
    }
  }
  Address_00 = (void *)(ulong)uVar1;
joined_r0x0014cc76:
  if (uVar3 != 0x1000000) {
    Inst->writeback = true;
    uVar10 = uVar10 + (uint)((Insn >> 0x18 & 1) == 0) * 0x200 + 0x200;
    uVar4 = MCInst_getOpcode(Inst);
    Address_00 = Address_01;
    if ((((uVar4 - 0x1a8 < 0xc) &&
         (pvVar7 = (void *)0xc87, (0xc87U >> (uVar4 - 0x1a8 & 0x1f) & 1) != 0)) &&
        (DVar5 = DecodeGPRRegisterClass(Inst,RegNo_00,(uint64_t)Address_01,(void *)0xc87),
        Address_00 = extraout_RDX, DVar5 != MCDisassembler_Success)) &&
       (DVar5 != MCDisassembler_SoftFail)) {
      return MCDisassembler_Fail;
    }
  }
  DVar5 = DecodeGPRRegisterClass(Inst,uVar9,(uint64_t)Address_00,pvVar7);
  if ((DVar5 == MCDisassembler_Success) || (DVar5 == MCDisassembler_SoftFail)) {
    uVar9 = MCInst_getOpcode(Inst);
    if (((2 < uVar9 - 0x1a8) && (Address_04 = Address_02, 2 < uVar9 - 0xa0)) ||
       ((DVar5 = DecodeGPRRegisterClass(Inst,uVar2,Address_02,(void *)(ulong)(uVar9 - 0x1a8)),
        Address_04 = extraout_RDX_00, DVar5 == MCDisassembler_Success ||
        (DVar5 == MCDisassembler_SoftFail)))) {
      pvVar7 = (void *)(ulong)uVar3;
      if (uVar3 != 0x1000000) {
        uVar2 = MCInst_getOpcode(Inst);
        Address_04 = Address_03;
        if ((((uVar2 - 0xa0 < 0x19) &&
             (pvVar7 = (void *)0x19e8e87, (0x19e8e87U >> (uVar2 - 0xa0 & 0x1f) & 1) != 0)) &&
            (DVar5 = DecodeGPRRegisterClass(Inst,RegNo_00,Address_03,(void *)0x19e8e87),
            Address_04 = extraout_RDX_01, DVar5 != MCDisassembler_Success)) &&
           (DVar5 != MCDisassembler_SoftFail)) {
          return MCDisassembler_Fail;
        }
      }
      DVar5 = DecodeGPRRegisterClass(Inst,RegNo_00,Address_04,pvVar7);
      pvVar7 = (void *)(ulong)uVar1;
      if ((DVar5 == MCDisassembler_Success) || (DVar5 == MCDisassembler_SoftFail)) {
        if ((uVar1 & 1) == 0) {
          DVar5 = DecodeGPRRegisterClass(Inst,RegNo,Address_05,pvVar7);
          if ((DVar5 != MCDisassembler_Success) && (DVar5 != MCDisassembler_SoftFail)) {
            return MCDisassembler_Fail;
          }
        }
        else {
          MCOperand_CreateReg0(Inst,0);
          uVar10 = (Insn >> 8 & 0xf) * 0x10 + RegNo | uVar10;
        }
        MCOperand_CreateImm0(Inst,(ulong)uVar10);
        DVar5 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_06,pvVar7);
        DVar5 = (*(code *)(&DAT_001c204c + *(int *)(&DAT_001c204c + (ulong)DVar5 * 4)))();
        return DVar5;
      }
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeAddrMode3Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned type = fieldFromInstruction_4(Insn, 22, 1);
	unsigned imm = fieldFromInstruction_4(Insn, 8, 4);
	unsigned U = ((~fieldFromInstruction_4(Insn, 23, 1)) & 1) << 8;
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	unsigned Rt2 = Rt + 1;

	bool writeback = (W == 1) | (P == 0);

	// For {LD,ST}RD, Rt must be even, else undefined.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (Rt & 0x1) S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
			if (P == 0 && W == 1)
				S = MCDisassembler_SoftFail;

			if (writeback && (Rn == 15 || Rn == Rt || Rn == Rt2))
				S = MCDisassembler_SoftFail;
			if (type && Rm == 15)
				S = MCDisassembler_SoftFail;
			if (Rt2 == 15)
				S = MCDisassembler_SoftFail;
			if (!type && fieldFromInstruction_4(Insn, 8, 4))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_STRH:
		case ARM_STRH_PRE:
		case ARM_STRH_POST:
			if (Rt == 15)
				S = MCDisassembler_SoftFail;
			if (writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			if (!type && Rm == 15)
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (type && Rn == 15){
				if (Rt2 == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (P == 0 && W == 1)
				S = MCDisassembler_SoftFail;
			if (!type && (Rt2 == 15 || Rm == 15 || Rm == Rt || Rm == Rt2))
				S = MCDisassembler_SoftFail;
			if (!type && writeback && Rn == 15)
				S = MCDisassembler_SoftFail;
			if (writeback && (Rn == Rt || Rn == Rt2))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRH:
		case ARM_LDRH_PRE:
		case ARM_LDRH_POST:
			if (type && Rn == 15){
				if (Rt == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (Rt == 15)
				S = MCDisassembler_SoftFail;
			if (!type && Rm == 15)
				S = MCDisassembler_SoftFail;
			if (!type && writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRSH:
		case ARM_LDRSH_PRE:
		case ARM_LDRSH_POST:
		case ARM_LDRSB:
		case ARM_LDRSB_PRE:
		case ARM_LDRSB_POST:
			if (type && Rn == 15){
				if (Rt == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (type && (Rt == 15 || (writeback && Rn == Rt)))
				S = MCDisassembler_SoftFail;
			if (!type && (Rt == 15 || Rm == 15))
				S = MCDisassembler_SoftFail;
			if (!type && writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	if (writeback) { // Writeback
		Inst->writeback = true;
		if (P)
			U |= ARMII_IndexModePre << 9;
		else
			U |= ARMII_IndexModePost << 9;

		// On stores, the writeback operand precedes Rt.
		switch (MCInst_getOpcode(Inst)) {
			case ARM_STRD:
			case ARM_STRD_PRE:
			case ARM_STRD_POST:
			case ARM_STRH:
			case ARM_STRH_PRE:
			case ARM_STRH_POST:
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
					return MCDisassembler_Fail;
				break;
			default:
				break;
		}
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt+1, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (writeback) {
		// On loads, the writeback operand comes after Rt.
		switch (MCInst_getOpcode(Inst)) {
			case ARM_LDRD:
			case ARM_LDRD_PRE:
			case ARM_LDRD_POST:
			case ARM_LDRH:
			case ARM_LDRH_PRE:
			case ARM_LDRH_POST:
			case ARM_LDRSH:
			case ARM_LDRSH_PRE:
			case ARM_LDRSH_POST:
			case ARM_LDRSB:
			case ARM_LDRSB_PRE:
			case ARM_LDRSB_POST:
			case ARM_LDRHTr:
			case ARM_LDRSBTr:
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
					return MCDisassembler_Fail;
				break;
			default:
				break;
		}
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	if (type) {
		MCOperand_CreateReg0(Inst, 0);
		MCOperand_CreateImm0(Inst, U | (imm << 4) | Rm);
	} else {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
		MCOperand_CreateImm0(Inst, U);
	}

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}